

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O3

iter_type __thiscall
booster::locale::impl_icu::num_parse<wchar_t>::do_real_get<unsigned_short>
          (num_parse<wchar_t> *this,iter_type in,iter_type end,ios_base *ios,iostate *err,
          unsigned_short *val)

{
  int *piVar1;
  iter_type iVar2;
  pointer pwVar3;
  bool bVar4;
  int_type iVar5;
  int_type iVar6;
  int iVar7;
  ulong uVar8;
  int_type iVar9;
  streambuf_type *psVar10;
  ulong uVar11;
  iter_type __beg;
  iter_type iVar12;
  iter_type iVar13;
  cast_type value;
  pointer local_60;
  long *local_58;
  string_type tmp;
  
  iVar12._M_sbuf = end._M_sbuf;
  psVar10 = in._M_sbuf;
  iVar6 = in._M_c;
  local_58 = (long *)__dynamic_cast(ios,&std::ios_base::typeinfo,&std::wistream::typeinfo,
                                    0xffffffffffffffff);
  iVar9 = end._M_c;
  if ((local_58 != (long *)0x0) && (bVar4 = num_base::use_parent<unsigned_short>(ios,0), !bVar4)) {
    formatter<wchar_t>::create((formatter<wchar_t> *)&tmp,ios,&this->loc_,&this->enc_);
    local_60 = tmp._M_dataplus._M_p;
    if (tmp._M_dataplus._M_p != (pointer)0x0) {
      tmp._M_string_length = 0;
      tmp.field_2._M_local_buf[0] = L'\0';
      tmp._M_dataplus._M_p = (pointer)&tmp.field_2;
      std::__cxx11::wstring::reserve((ulong)&tmp);
LAB_001919fe:
      iVar5 = iVar6;
      if (iVar6 == 0xffffffff && psVar10 != (streambuf_type *)0x0) {
        if (*(int_type **)(psVar10 + 0x10) < *(int_type **)(psVar10 + 0x18)) {
          iVar5 = **(int_type **)(psVar10 + 0x10);
        }
        else {
          iVar5 = (**(code **)(*(long *)psVar10 + 0x48))(psVar10);
        }
        if (iVar5 == 0xffffffff) {
          psVar10 = (streambuf_type *)0x0;
        }
      }
      if (iVar12._M_sbuf == (streambuf_type *)0x0 || iVar9 != 0xffffffff) {
        if ((iVar9 == 0xffffffff) == (iVar5 == 0xffffffff)) goto LAB_00191c7b;
      }
      else {
        if (*(int **)(iVar12._M_sbuf + 0x10) < *(int **)(iVar12._M_sbuf + 0x18)) {
          iVar7 = **(int **)(iVar12._M_sbuf + 0x10);
        }
        else {
          iVar7 = (**(code **)(*(long *)iVar12._M_sbuf + 0x48))(iVar12._M_sbuf);
        }
        if (iVar7 == -1) {
          iVar12._M_sbuf = (streambuf_type *)0x0;
          if (iVar5 == 0xffffffff) goto LAB_00191c7b;
        }
        else if (iVar5 != 0xffffffff) goto LAB_00191c7b;
      }
      iVar5 = iVar6;
      if (psVar10 != (streambuf_type *)0x0 && iVar6 == 0xffffffff) {
        if (*(int_type **)(psVar10 + 0x10) < *(int_type **)(psVar10 + 0x18)) {
          iVar5 = **(int_type **)(psVar10 + 0x10);
        }
        else {
          iVar5 = (**(code **)(*(long *)psVar10 + 0x48))(psVar10);
        }
        if (iVar5 == 0xffffffff) {
          psVar10 = (streambuf_type *)0x0;
        }
      }
      if (iVar5 != 0x7f && 0x1f < iVar5 - 1) goto LAB_00191c7b;
      if (*(ulong *)(psVar10 + 0x10) < *(ulong *)(psVar10 + 0x18)) {
        *(ulong *)(psVar10 + 0x10) = *(ulong *)(psVar10 + 0x10) + 4;
        iVar6 = 0xffffffff;
      }
      else {
        iVar6 = 0xffffffff;
        (**(code **)(*(long *)psVar10 + 0x50))(psVar10);
      }
      goto LAB_001919fe;
    }
  }
  __beg._12_4_ = 0;
  __beg._M_sbuf = (streambuf_type *)SUB128(in._0_12_,0);
  __beg._M_c = SUB124(in._0_12_,8);
  iVar12._8_8_ = end._8_8_ & 0xffffffff;
  iVar12 = std::num_get<wchar_t,std::istreambuf_iterator<wchar_t,std::char_traits<wchar_t>>>::
           _M_extract_int_abi_cxx11_<unsigned_short>
                     ((num_get<wchar_t,std::istreambuf_iterator<wchar_t,std::char_traits<wchar_t>>>
                       *)this,__beg,iVar12,ios,err,val);
  iVar13._M_sbuf = iVar12._M_sbuf;
  iVar13._M_c = iVar12._M_c;
  iVar13._12_4_ = iVar12._12_4_;
  return iVar13;
LAB_00191c7b:
  if (0xfff < tmp._M_string_length) goto LAB_00191c8a;
  iVar5 = iVar6;
  if (iVar6 == 0xffffffff && psVar10 != (streambuf_type *)0x0) {
    if (*(int_type **)(psVar10 + 0x10) < *(int_type **)(psVar10 + 0x18)) {
      iVar5 = **(int_type **)(psVar10 + 0x10);
    }
    else {
      iVar5 = (**(code **)(*(long *)psVar10 + 0x48))(psVar10);
    }
    if (iVar5 == 0xffffffff) {
      psVar10 = (streambuf_type *)0x0;
    }
  }
  if (iVar12._M_sbuf == (streambuf_type *)0x0 || iVar9 != 0xffffffff) {
    if ((iVar9 == 0xffffffff) == (iVar5 == 0xffffffff)) goto LAB_00191c8a;
  }
  else {
    if (*(int **)(iVar12._M_sbuf + 0x10) < *(int **)(iVar12._M_sbuf + 0x18)) {
      iVar7 = **(int **)(iVar12._M_sbuf + 0x10);
    }
    else {
      iVar7 = (**(code **)(*(long *)iVar12._M_sbuf + 0x48))(iVar12._M_sbuf);
    }
    if (iVar7 == -1) {
      iVar12._M_sbuf = (streambuf_type *)0x0;
      if (iVar5 == 0xffffffff) goto LAB_00191c8a;
    }
    else if (iVar5 != 0xffffffff) goto LAB_00191c8a;
  }
  if (psVar10 == (streambuf_type *)0x0 || iVar6 != 0xffffffff) {
LAB_00191be3:
    if (iVar6 == 10) goto LAB_00191c8a;
  }
  else {
    if (*(int_type **)(psVar10 + 0x10) < *(int_type **)(psVar10 + 0x18)) {
      iVar6 = **(int_type **)(psVar10 + 0x10);
    }
    else {
      iVar6 = (**(code **)(*(long *)psVar10 + 0x48))(psVar10);
    }
    if (iVar6 != 0xffffffff) goto LAB_00191be3;
    psVar10 = (streambuf_type *)0x0;
  }
  piVar1 = *(int **)(psVar10 + 0x10);
  if (piVar1 < *(int **)(psVar10 + 0x18)) {
    iVar7 = *piVar1;
    *(int **)(psVar10 + 0x10) = piVar1 + 1;
  }
  else {
    iVar7 = (**(code **)(*(long *)psVar10 + 0x50))(psVar10);
  }
  if ((iVar7 == -1) && (*(ulong *)(psVar10 + 0x18) <= *(ulong *)(psVar10 + 0x10))) {
    (**(code **)(*(long *)psVar10 + 0x48))(psVar10);
  }
  iVar6 = 0xffffffff;
  std::__cxx11::wstring::push_back((wchar_t)&tmp);
  goto LAB_00191c7b;
LAB_00191c8a:
  pwVar3 = local_60;
  uVar8 = (**(code **)(*(long *)local_60 + 0x38))(local_60,&tmp,&value);
  uVar11 = tmp._M_string_length;
  if ((uVar8 == 0) || (0xffff < (uint)value)) {
    *(undefined1 *)err = (char)*err | _S_failbit;
  }
  else {
    *val = (unsigned_short)value;
  }
  for (; uVar8 < uVar11; uVar11 = uVar11 - 1) {
    std::wistream::putback((wchar_t)local_58);
  }
  psVar10 = *(streambuf_type **)((long)local_58 + *(long *)(*local_58 + -0x18) + 0xe8);
  if (psVar10 == (streambuf_type *)0x0) {
    bVar4 = true;
    psVar10 = (streambuf_type *)0x0;
  }
  else {
    if (*(int **)(psVar10 + 0x10) < *(int **)(psVar10 + 0x18)) {
      iVar7 = **(int **)(psVar10 + 0x10);
    }
    else {
      iVar7 = (**(code **)(*(long *)psVar10 + 0x48))(psVar10);
    }
    bVar4 = iVar7 == -1;
    if (bVar4) {
      psVar10 = (streambuf_type *)0x0;
    }
  }
  if (iVar12._M_sbuf == (streambuf_type *)0x0 || iVar9 != 0xffffffff) {
    if ((iVar9 != 0xffffffff) == bVar4) goto LAB_00191d9b;
  }
  else {
    if (*(int **)(iVar12._M_sbuf + 0x10) < *(int **)(iVar12._M_sbuf + 0x18)) {
      iVar7 = **(int **)(iVar12._M_sbuf + 0x10);
    }
    else {
      iVar7 = (**(code **)(*(long *)iVar12._M_sbuf + 0x48))(iVar12._M_sbuf);
    }
    if (bVar4 != (iVar7 == -1)) goto LAB_00191d9b;
  }
  *(undefined1 *)err = (char)*err | _S_eofbit;
LAB_00191d9b:
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)tmp._M_dataplus._M_p != &tmp.field_2) {
    operator_delete(tmp._M_dataplus._M_p);
  }
  (**(code **)(*(long *)pwVar3 + 8))(pwVar3);
  iVar2._8_8_ = 0xffffffff;
  iVar2._M_sbuf = psVar10;
  return iVar2;
}

Assistant:

iter_type do_real_get(iter_type in,iter_type end,std::ios_base &ios,std::ios_base::iostate &err,ValueType &val) const
    {
        formatter_ptr formatter;
        stream_type *stream_ptr = dynamic_cast<stream_type *>(&ios);

        if(!stream_ptr || use_parent<ValueType>(ios,0) || (formatter = formatter_type::create(ios,loc_,enc_)).get()==0) {
            return std::num_get<CharType>::do_get(in,end,ios,err,val);
        }

        typedef typename details::cast_traits<ValueType>::cast_type cast_type;
        string_type tmp;
        tmp.reserve(64);

        CharType c;
        while(in!=end && (((c=*in)<=32 && (c>0)) || c==127)) // Assuming that ASCII is a subset
            ++in;

        while(tmp.size() < 4096 && in!=end && *in!='\n') {
            tmp += *in++;
        }

        cast_type value;
        size_t parsed_chars;

        if((parsed_chars = formatter->parse(tmp,value))==0 || !valid<ValueType>(value)) {
            err |= std::ios_base::failbit;
        }
        else {
            val=static_cast<ValueType>(value);
        }

        for(size_t n=tmp.size();n>parsed_chars;n--) {
            stream_ptr->putback(tmp[n-1]);
        }

        in = iter_type(*stream_ptr);

        if(in==end)
            err |=std::ios_base::eofbit;
        return in;
    }